

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sampler_test.cc
# Opt level: O2

void __thiscall
SamplerTest_bytes_until_sample_Overflow_Underflow_Test::TestBody
          (SamplerTest_bytes_until_sample_Overflow_Underflow_Test *this)

{
  long lVar1;
  ostream *poVar2;
  ulong uVar3;
  ulong uVar4;
  _Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  _Var5;
  char *pcVar6;
  double dVar7;
  undefined1 auVar8 [16];
  undefined1 auStack_d8 [8];
  Sampler sampler;
  uint64_t sample_parameter_array [4];
  unsigned_long local_78;
  uint64_t cutoff;
  uint64_t smallest_sample_step;
  AssertionResult gtest_ar;
  __uniq_ptr_impl<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_48;
  uint64_t largest_sample_step;
  _Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  local_38;
  
  auStack_d8 = (undefined1  [8])0x0;
  sampler.bytes_until_sample_ = 0;
  sampler.rnd_._0_1_ = 0;
  tcmalloc::Sampler::Init((Sampler *)auStack_d8,1);
  sample_parameter_array[0] = 1;
  sample_parameter_array[1] = 0x80000;
  sample_parameter_array[2] = 0x400000000000000;
  lVar1 = 0;
  while( true ) {
    if (lVar1 == 4) {
      return;
    }
    uVar4 = sample_parameter_array[lVar1 + -1];
    poVar2 = std::operator<<((ostream *)&std::cerr,"\n");
    poVar2 = std::operator<<(poVar2,"sample_parameter = ");
    std::ostream::_M_insert<unsigned_long>((ulong)poVar2);
    auVar8._8_4_ = (int)(uVar4 >> 0x20);
    auVar8._0_8_ = uVar4;
    auVar8._12_4_ = 0x45300000;
    sample_parameter_array[3] =
         (uint64_t)
         (((auVar8._8_8_ - 1.9342813113834067e+25) +
          ((double)CONCAT44(0x43300000,(int)uVar4) - 4503599627370496.0)) * -0.6931471805599453);
    poVar2 = std::operator<<((ostream *)&std::cerr,"\n");
    StringPrintf_abi_cxx11_((string *)&smallest_sample_step,"q = %f\n",0x4190000000000000);
    std::operator<<(poVar2,(string *)&smallest_sample_step);
    std::__cxx11::string::~string((string *)&smallest_sample_step);
    poVar2 = std::operator<<((ostream *)&std::cerr,"\n");
    StringPrintf_abi_cxx11_((string *)&smallest_sample_step,"log2(q) = %f\n",0x403a000000000000);
    std::operator<<(poVar2,(string *)&smallest_sample_step);
    std::__cxx11::string::~string((string *)&smallest_sample_step);
    dVar7 = (double)sample_parameter_array[3] * 0.0 + 1.0;
    uVar3 = (ulong)dVar7;
    cutoff = (long)(dVar7 - 9.223372036854776e+18) & (long)uVar3 >> 0x3f | uVar3;
    poVar2 = std::operator<<((ostream *)&std::cerr,"\n");
    poVar2 = std::operator<<(poVar2,"Smallest sample step is ");
    std::ostream::_M_insert<unsigned_long>((ulong)poVar2);
    local_78 = (uVar4 >> 0x18) * 10 + 10;
    poVar2 = std::operator<<((ostream *)&std::cerr,"\n");
    poVar2 = std::operator<<(poVar2,"Acceptable value is < ");
    std::ostream::_M_insert<unsigned_long>((ulong)poVar2);
    testing::internal::CmpHelperLE<unsigned_long,unsigned_long>
              ((internal *)&smallest_sample_step,"smallest_sample_step","cutoff",&cutoff,&local_78);
    if ((char)smallest_sample_step == '\0') {
      testing::Message::Message((Message *)&local_48);
      if (gtest_ar._0_8_ == 0) {
        pcVar6 = "";
      }
      else {
        pcVar6 = *(char **)gtest_ar._0_8_;
      }
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)&local_38,kFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/alk[P]gperftools/src/tests/sampler_test.cc"
                 ,0x186,pcVar6);
      testing::internal::AssertHelper::operator=((AssertHelper *)&local_38,(Message *)&local_48);
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_38);
      _Var5._M_head_impl =
           (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)
           local_48._M_t.
           super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           .
           super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
           ._M_head_impl;
      goto LAB_0010ba37;
    }
    std::
    unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~unique_ptr((unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)&gtest_ar);
    poVar2 = std::operator<<((ostream *)&std::cerr,"\n");
    StringPrintf_abi_cxx11_((string *)&smallest_sample_step,"q = %f\n",0x3ff0000000000000);
    std::operator<<(poVar2,(string *)&smallest_sample_step);
    std::__cxx11::string::~string((string *)&smallest_sample_step);
    dVar7 = (double)sample_parameter_array[3] * -26.0 + 1.0;
    uVar4 = (ulong)dVar7;
    local_48._M_t.
    super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    .
    super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
    ._M_head_impl =
         (tuple<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          )((long)(dVar7 - 9.223372036854776e+18) & (long)uVar4 >> 0x3f | uVar4);
    poVar2 = std::operator<<((ostream *)&std::cerr,"\n");
    poVar2 = std::operator<<(poVar2,"Largest sample step is ");
    std::ostream::_M_insert<unsigned_long>((ulong)poVar2);
    local_38._M_head_impl =
         (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)
         0x8000000000000000;
    testing::internal::CmpHelperLE<unsigned_long,unsigned_long>
              ((internal *)&smallest_sample_step,"largest_sample_step","one<<63",
               (unsigned_long *)&local_48,(unsigned_long *)&local_38);
    if ((char)smallest_sample_step == '\0') break;
    std::
    unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~unique_ptr((unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)&gtest_ar);
    testing::internal::CmpHelperGE<unsigned_long,unsigned_long>
              ((internal *)&smallest_sample_step,"largest_sample_step","smallest_sample_step",
               (unsigned_long *)&local_48,&cutoff);
    if ((char)smallest_sample_step == '\0') {
      testing::Message::Message((Message *)&local_38);
      if (gtest_ar._0_8_ == 0) {
        pcVar6 = "";
      }
      else {
        pcVar6 = *(char **)gtest_ar._0_8_;
      }
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)&largest_sample_step,kFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/alk[P]gperftools/src/tests/sampler_test.cc"
                 ,0x191,pcVar6);
      testing::internal::AssertHelper::operator=
                ((AssertHelper *)&largest_sample_step,(Message *)&local_38);
      goto LAB_0010ba2a;
    }
    std::
    unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~unique_ptr((unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)&gtest_ar);
    lVar1 = lVar1 + 1;
  }
  testing::Message::Message((Message *)&local_38);
  if (gtest_ar._0_8_ == 0) {
    pcVar6 = "";
  }
  else {
    pcVar6 = *(char **)gtest_ar._0_8_;
  }
  testing::internal::AssertHelper::AssertHelper
            ((AssertHelper *)&largest_sample_step,kFatalFailure,
             "/workspace/llm4binary/github/license_all_cmakelists_25/alk[P]gperftools/src/tests/sampler_test.cc"
             ,400,pcVar6);
  testing::internal::AssertHelper::operator=
            ((AssertHelper *)&largest_sample_step,(Message *)&local_38);
LAB_0010ba2a:
  testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&largest_sample_step);
  _Var5._M_head_impl = local_38._M_head_impl;
LAB_0010ba37:
  if ((_Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
       )_Var5._M_head_impl !=
      (_Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
       )0x0) {
    (**(code **)(*(long *)_Var5._M_head_impl + 8))();
  }
  std::
  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~unique_ptr((unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)&gtest_ar);
  return;
}

Assistant:

TEST_F(SamplerTest, bytes_until_sample_Overflow_Underflow) {
  tcmalloc::Sampler sampler;
  sampler.Init(1);
  uint64_t one = 1;
  // sample_parameter = 0;  // To test the edge case
  uint64_t sample_parameter_array[4] = {0, 1, one<<19, one<<58};
  for (int i = 0; i < 4; i++) {
    uint64_t sample_parameter = sample_parameter_array[i];
    LOG(INFO) << "sample_parameter = " << sample_parameter;
    double sample_scaling = - log(2.0) * sample_parameter;
    // Take the top 26 bits as the random number
    // (This plus the 1<<26 sampling bound give a max step possible of
    // 1209424308 bytes.)
    const uint64_t prng_mod_power = 48;  // Number of bits in prng

    // First, check the largest_prng value
    uint64_t largest_prng_value = (static_cast<uint64_t>(1)<<48) - 1;
    double q = (largest_prng_value >> (prng_mod_power - 26)) + 1.0;
    LOG(INFO) << StringPrintf("q = %f\n", q);
    LOG(INFO) << StringPrintf("log2(q) = %f\n", log(q)/log(2.0));
    uint64_t smallest_sample_step
      = static_cast<uint64_t>(std::min(log2(q) - 26, 0.0)
                              * sample_scaling + 1);
    LOG(INFO) << "Smallest sample step is " << smallest_sample_step;
    uint64_t cutoff = static_cast<uint64_t>(10)
                      * (sample_parameter/(one<<24) + 1);
    LOG(INFO) << "Acceptable value is < " << cutoff;
    // This checks that the answer is "small" and positive
    ASSERT_LE(smallest_sample_step, cutoff);

    // Next, check with the smallest prng value
    uint64_t smallest_prng_value = 0;
    q = (smallest_prng_value >> (prng_mod_power - 26)) + 1.0;
    LOG(INFO) << StringPrintf("q = %f\n", q);
    uint64_t largest_sample_step
      = static_cast<uint64_t>(std::min(log2(q) - 26, 0.0)
                              * sample_scaling + 1);
    LOG(INFO) << "Largest sample step is " << largest_sample_step;
    ASSERT_LE(largest_sample_step, one<<63);
    ASSERT_GE(largest_sample_step, smallest_sample_step);
  }
}